

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

wchar_t ma_strcpy_s(char *dst,size_t dstSizeInBytes,char *src)

{
  wchar_t wVar1;
  size_t sVar2;
  
  if (dst == (char *)0x0) {
    return L'\x16';
  }
  if (dstSizeInBytes == 0) {
    return L'\"';
  }
  if (src == (char *)0x0) {
    wVar1 = L'\x16';
  }
  else {
    sVar2 = 0;
    do {
      if (src[sVar2] == '\0') {
        dst = dst + sVar2;
        wVar1 = L'\0';
        goto LAB_0018fde8;
      }
      dst[sVar2] = src[sVar2];
      sVar2 = sVar2 + 1;
    } while (dstSizeInBytes != sVar2);
    wVar1 = L'\"';
  }
LAB_0018fde8:
  *dst = '\0';
  return wVar1;
}

Assistant:

MA_API int ma_strcpy_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstSizeInBytes && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstSizeInBytes) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}